

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O0

int unz64local_getShort(zlib_filefunc64_32_def *pzlib_filefunc_def,voidpf filestream,uLong *pX)

{
  int local_30;
  int local_2c;
  int err;
  int i;
  uLong x;
  uLong *pX_local;
  voidpf filestream_local;
  zlib_filefunc64_32_def *pzlib_filefunc_def_local;
  
  local_2c = 0;
  x = (uLong)pX;
  pX_local = (uLong *)filestream;
  filestream_local = pzlib_filefunc_def;
  local_30 = unz64local_getByte(pzlib_filefunc_def,filestream,&local_2c);
  _err = (ulong)local_2c;
  if (local_30 == 0) {
    local_30 = unz64local_getByte((zlib_filefunc64_32_def *)filestream_local,pX_local,&local_2c);
  }
  if (local_30 == 0) {
    *(ulong *)x = (long)local_2c << 8 | _err;
  }
  else {
    *(undefined8 *)x = 0;
  }
  return local_30;
}

Assistant:

local int unz64local_getShort(const zlib_filefunc64_32_def* pzlib_filefunc_def,
    voidpf filestream,
    uLong* pX)
{
    uLong x;
    int i = 0;
    int err;

    err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x = (uLong)i;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((uLong)i) << 8;

    if (err == UNZ_OK)
        *pX = x;
    else
        *pX = 0;
    return err;
}